

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds01_pair_sum.cpp
# Opt level: O0

int main(void)

{
  long lVar1;
  key_type *pkVar2;
  long lVar3;
  bool bVar4;
  pointer ppVar5;
  undefined8 uStack_c0;
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  mapped_type *local_a8;
  long local_a0;
  _Self local_98;
  int local_8c;
  _Self local_88;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_80;
  int local_74;
  int local_70;
  int i_1;
  int tgt;
  int local_5c;
  undefined1 local_58 [4];
  int i;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> mi;
  unsigned_long __vla_expr0;
  int local_14;
  uint local_10;
  int m;
  int n;
  
  m = 0;
  uStack_c0 = 0x101238;
  __isoc99_scanf("%d%d",&local_10,&local_14);
  mi._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_10;
  lVar3 = -(mi._M_t._M_impl.super__Rb_tree_header._M_node_count * 4 + 0xf & 0xfffffffffffffff0);
  local_a0 = (long)&local_b8 + lVar3;
  *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x10126b;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_58)
  ;
  for (local_5c = 0; local_5c < (int)local_10; local_5c = local_5c + 1) {
    lVar1 = local_a0 + (long)local_5c * 4;
    *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x101297;
    __isoc99_scanf("%d",lVar1);
    pkVar2 = (key_type *)(local_a0 + (long)local_5c * 4);
    *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x1012b1;
    local_a8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)local_58,pkVar2);
    *local_a8 = *local_a8 + 1;
  }
LAB_001012f1:
  do {
    if (local_14 == 0) {
      local_14 = local_14 + -1;
      *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x10143b;
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 local_58);
      return m;
    }
    local_14 = local_14 + -1;
    *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x101317;
    __isoc99_scanf("%d",&local_70);
    for (local_74 = 0; local_74 < (int)local_10; local_74 = local_74 + 1) {
      if (*(int *)(local_a0 + (long)local_74 * 4) << 1 == local_70) {
        pkVar2 = (key_type *)(local_a0 + (long)local_74 * 4);
        *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x101359;
        local_b0 = (_Base_ptr)
                   std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   find((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)local_58,pkVar2);
        local_80._M_node = local_b0;
        *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x101376;
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_80);
        if (1 < ppVar5->second) {
          *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x10138a;
          printf("YES\n");
          goto LAB_001012f1;
        }
      }
      else {
        local_8c = local_70 - *(int *)(local_a0 + (long)local_74 * 4);
        *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x1013bc;
        local_b8 = (_Base_ptr)
                   std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   find((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)local_58,&local_8c);
        local_88._M_node = local_b8;
        *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x1013d9;
        local_98._M_node =
             (_Base_ptr)
             std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                       ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)local_58);
        *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x1013f0;
        bVar4 = std::operator!=(&local_88,&local_98);
        if (bVar4) {
          *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x101404;
          printf("YES\n");
          goto LAB_001012f1;
        }
      }
    }
    *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x10142b;
    printf("NO\n");
  } while( true );
}

Assistant:

int main() {
    int n, m;
    scanf("%d%d", &n, &m);
    int arr[n];
    map<int, int> mi;
    for (int i = 0; i < n; ++i) {
        scanf("%d", &arr[i]);
        mi[arr[i]]++;
    }
wl:
    while (m--) {
        int tgt;
        scanf("%d", &tgt);
        for (int i = 0; i < n; ++i) {
            if (2 * arr[i] == tgt) {
                if (mi.find(arr[i])->second > 1) {
                    printf("YES\n");
                    goto wl;
                }
            } else if (mi.find(tgt - arr[i]) != mi.end()) {
                printf("YES\n");
                goto wl;
            }
        }
        printf("NO\n");
    }
}